

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O1

Vec_Int_t * Abc_ManExpandCex(Gia_Man_t *pGia,Vec_Int_t *vCex)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  iVar2 = vCex->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar3;
  iVar2 = pGia->nRegs;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      iVar1 = pGia->vCis->nSize;
      uVar6 = (iVar1 - iVar2) + iVar7;
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
LAB_002bd7ce:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pGia->vCis->pArray[uVar6];
      if ((iVar2 < 0) || (pGia->nObjs <= iVar2)) {
LAB_002bd7af:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p,0);
      iVar7 = iVar7 + 1;
      iVar2 = pGia->nRegs;
    } while (iVar7 < iVar2);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  uVar6 = pGia->nRegs;
  do {
    pVVar4 = pGia->vCis;
    uVar5 = (ulong)(uint)pVVar4->nSize;
    if (pGia->nRegs < pVVar4->nSize) {
      lVar8 = 0;
      do {
        if ((int)uVar5 <= lVar8) goto LAB_002bd7ce;
        iVar2 = pVVar4->pArray[lVar8];
        if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_002bd7af;
        if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
        if (pGia->pRefs[iVar2] == 0) {
          iVar2 = 0;
        }
        else {
          if (uVar6 == vCex->nSize) break;
          if (((int)uVar6 < 0) || (vCex->nSize <= (int)uVar6)) goto LAB_002bd7ce;
          uVar5 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          iVar2 = vCex->pArray[uVar5];
        }
        Vec_IntPush(p,iVar2);
        lVar8 = lVar8 + 1;
        pVVar4 = pGia->vCis;
        uVar5 = (ulong)pVVar4->nSize;
      } while (lVar8 < (long)(uVar5 - (long)pGia->nRegs));
    }
    if (uVar6 == vCex->nSize) {
      return p;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Abc_ManExpandCex( Gia_Man_t * pGia, Vec_Int_t * vCex )
{
    Vec_Int_t * vCexNew;
    Gia_Obj_t * pObj;
    int i, k;

    // start with register outputs
    vCexNew = Vec_IntAlloc( Vec_IntSize(vCex) );
    Gia_ManForEachRo( pGia, pObj, i )
        Vec_IntPush( vCexNew, 0 );

    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    k = Gia_ManRegNum( pGia );
    while ( 1 )
    {
        Gia_ManForEachPi( pGia, pObj, i )
        {
            if ( Gia_ObjRefNum(pGia, pObj) == 0 )
                Vec_IntPush( vCexNew, 0 );
            else
            {
                if ( k == Vec_IntSize(vCex) )
                    break;
                Vec_IntPush( vCexNew, Vec_IntEntry(vCex, k++) );
            }
        }
        if ( k == Vec_IntSize(vCex) )
            break;
    }
    return vCexNew;
}